

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorBlock.cpp
# Opt level: O3

int __thiscall nv::ColorBlock::init(ColorBlock *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  anon_struct_4_4_d8359877_for_anon_union_4_2_12391d8d_for_Color32_0_0 aVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  anon_struct_4_4_d8359877_for_anon_union_4_2_12391d8d_for_Color32_0_0 *paVar7;
  int in_ECX;
  int in_EDX;
  uint e;
  long lVar8;
  long lVar9;
  
  uVar4 = Image::width((Image *)ctx);
  uVar3 = uVar4 - in_EDX;
  if (3 < uVar4 - in_EDX) {
    uVar3 = 4;
  }
  uVar4 = Image::height((Image *)ctx);
  uVar5 = uVar4 - in_ECX;
  if (3 < uVar5) {
    uVar5 = 4;
  }
  lVar9 = 0;
  do {
    iVar6 = init::remainder[(ulong)(uVar5 * 4 - 4) + lVar9];
    lVar8 = 0;
    do {
      iVar1 = init::remainder[(ulong)(uVar3 * 4 - 4) + lVar8];
      uVar4 = Image::width((Image *)ctx);
      paVar7 = (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d8d_for_Color32_0_0 *)
               Image::pixel((Image *)ctx,iVar1 + in_EDX + uVar4 * (iVar6 + in_ECX));
      aVar2 = *paVar7;
      ((anon_union_4_2_12391d8d_for_Color32_0 *)((long)this + lVar8 * 4))->field_0 = aVar2;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    lVar9 = lVar9 + 1;
    this = (ColorBlock *)((long)this + 0x10);
  } while (lVar9 != 4);
  iVar6._0_1_ = aVar2.b;
  iVar6._1_1_ = aVar2.g;
  iVar6._2_1_ = aVar2.r;
  iVar6._3_1_ = aVar2.a;
  return iVar6;
}

Assistant:

void ColorBlock::init(const Image * img, uint x, uint y)
{
	nvDebugCheck(img != NULL);
	
	const uint bw = min(img->width() - x, 4U);
	const uint bh = min(img->height() - y, 4U);

	nvDebugCheck(bw != 0);
	nvDebugCheck(bh != 0);

	static int remainder[] = {
		0, 0, 0, 0,
		0, 1, 0, 1,
		0, 1, 2, 0,
		0, 1, 2, 3,
	};

	// Blocks that are smaller than 4x4 are handled by repeating the pixels.
	// @@ Thats only correct when block size is 1, 2 or 4, but not with 3. :(

	for(uint i = 0; i < 4; i++) {
		//const int by = i % bh;
		const int by = remainder[(bh - 1) * 4 + i];
		for(uint e = 0; e < 4; e++) {
			//const int bx = e % bw;
			const int bx = remainder[(bw - 1) * 4 + e];
			color(e, i) = img->pixel(x + bx, y + by);
		}
	}
}